

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_sse4.c
# Opt level: O0

void sse4x2_sse4_1(uint8_t *a,int a_stride,uint8_t *b,int b_stride,__m128i *sum)

{
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  void *in_RDI;
  int *in_R8;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined1 auVar1 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  __m128i v_d_w;
  __m128i v_b_w;
  __m128i v_a_w;
  __m128i v_b1;
  __m128i v_b0;
  __m128i v_a1;
  __m128i v_a0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 local_88;
  undefined4 uStack_84;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  undefined1 auVar2 [16];
  undefined1 auVar5 [16];
  
  xx_loadl_32(in_RDI);
  xx_loadl_32((void *)((long)in_RDI + (long)in_ESI));
  xx_loadl_32(in_RDX);
  xx_loadl_32((void *)((long)in_RDX + (long)in_ECX));
  local_88 = (undefined4)extraout_XMM0_Qa_00;
  uStack_84 = (undefined4)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  auVar2._8_4_ = (int)((ulong)extraout_XMM0_Qa >> 0x20);
  auVar2._0_8_ = extraout_XMM0_Qa;
  auVar2._12_4_ = uStack_84;
  auVar1._8_8_ = auVar2._8_8_;
  auVar1._0_8_ = CONCAT44(local_88,(int)extraout_XMM0_Qa);
  auVar3 = pmovzxbw(auVar1,auVar1._0_8_);
  local_a8 = (undefined4)extraout_XMM0_Qa_02;
  uStack_a4 = (undefined4)((ulong)extraout_XMM0_Qa_02 >> 0x20);
  auVar5._8_4_ = (int)((ulong)extraout_XMM0_Qa_01 >> 0x20);
  auVar5._0_8_ = extraout_XMM0_Qa_01;
  auVar5._12_4_ = uStack_a4;
  auVar4._8_8_ = auVar5._8_8_;
  auVar4._0_8_ = CONCAT44(local_a8,(int)extraout_XMM0_Qa_01);
  auVar6 = pmovzxbw(auVar4,auVar4._0_8_);
  local_58 = auVar3._0_2_;
  sStack_56 = auVar3._2_2_;
  sStack_54 = auVar3._4_2_;
  sStack_52 = auVar3._6_2_;
  sStack_50 = auVar3._8_2_;
  sStack_4e = auVar3._10_2_;
  sStack_4c = auVar3._12_2_;
  sStack_4a = auVar3._14_2_;
  local_68 = auVar6._0_2_;
  sStack_66 = auVar6._2_2_;
  sStack_64 = auVar6._4_2_;
  sStack_62 = auVar6._6_2_;
  sStack_60 = auVar6._8_2_;
  sStack_5e = auVar6._10_2_;
  sStack_5c = auVar6._12_2_;
  sStack_5a = auVar6._14_2_;
  auVar6._2_2_ = sStack_56 - sStack_66;
  auVar6._0_2_ = local_58 - local_68;
  auVar6._4_2_ = sStack_54 - sStack_64;
  auVar6._6_2_ = sStack_52 - sStack_62;
  auVar6._10_2_ = sStack_4e - sStack_5e;
  auVar6._8_2_ = sStack_50 - sStack_60;
  auVar6._12_2_ = sStack_4c - sStack_5c;
  auVar6._14_2_ = sStack_4a - sStack_5a;
  auVar3._2_2_ = sStack_56 - sStack_66;
  auVar3._0_2_ = local_58 - local_68;
  auVar3._4_2_ = sStack_54 - sStack_64;
  auVar3._6_2_ = sStack_52 - sStack_62;
  auVar3._10_2_ = sStack_4e - sStack_5e;
  auVar3._8_2_ = sStack_50 - sStack_60;
  auVar3._12_2_ = sStack_4c - sStack_5c;
  auVar3._14_2_ = sStack_4a - sStack_5a;
  auVar3 = pmaddwd(auVar6,auVar3);
  local_38 = (int)*(undefined8 *)in_R8;
  iStack_34 = (int)((ulong)*(undefined8 *)in_R8 >> 0x20);
  iStack_30 = (int)*(undefined8 *)(in_R8 + 2);
  iStack_2c = (int)((ulong)*(undefined8 *)(in_R8 + 2) >> 0x20);
  local_48 = auVar3._0_4_;
  iStack_44 = auVar3._4_4_;
  iStack_40 = auVar3._8_4_;
  iStack_3c = auVar3._12_4_;
  *in_R8 = local_38 + local_48;
  in_R8[1] = iStack_34 + iStack_44;
  in_R8[2] = iStack_30 + iStack_40;
  in_R8[3] = iStack_2c + iStack_3c;
  return;
}

Assistant:

static inline void sse4x2_sse4_1(const uint8_t *a, int a_stride,
                                 const uint8_t *b, int b_stride, __m128i *sum) {
  const __m128i v_a0 = xx_loadl_32(a);
  const __m128i v_a1 = xx_loadl_32(a + a_stride);
  const __m128i v_b0 = xx_loadl_32(b);
  const __m128i v_b1 = xx_loadl_32(b + b_stride);
  const __m128i v_a_w = _mm_cvtepu8_epi16(_mm_unpacklo_epi32(v_a0, v_a1));
  const __m128i v_b_w = _mm_cvtepu8_epi16(_mm_unpacklo_epi32(v_b0, v_b1));
  const __m128i v_d_w = _mm_sub_epi16(v_a_w, v_b_w);
  *sum = _mm_add_epi32(*sum, _mm_madd_epi16(v_d_w, v_d_w));
}